

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  ImVec2 IVar5;
  bool bVar6;
  ImU32 IVar7;
  ImGuiTableInstanceData *pIVar8;
  uint uVar9;
  ulong uVar10;
  ImGuiTableColumn *pIVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect outer_border;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 aIStack_60 [2];
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar3 = table->InnerWindow;
  bVar6 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (!bVar6) {
    return;
  }
  draw_list = pIVar3->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,&(table->Bg0ClipRectForDrawCmd).Min,&(table->Bg0ClipRectForDrawCmd).Max,false
            );
  if ((long)table->InstanceCurrent == 0) {
    pIVar8 = &table->InstanceDataFirst;
  }
  else {
    pIVar8 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  fVar16 = (table->InnerRect).Min.y;
  fVar15 = fVar16;
  if (table->FreezeRowsCount < 1) {
    fVar15 = (table->WorkRect).Min.y;
  }
  fVar15 = fVar15 + table->AngledHeadersHeight;
  uVar12 = -(uint)(fVar15 <= fVar16);
  uVar9 = table->Flags;
  fVar13 = 0.0;
  if ((uVar9 >> 8 & 1) != 0) {
    fVar13 = 1.0;
  }
  fVar13 = (float)(uVar12 & (uint)fVar16 | ~uVar12 & (uint)fVar15) + fVar13;
  fVar16 = (table->InnerRect).Max.y;
  fVar15 = fVar13;
  if ((table->IsUsingHeaders == true) &&
     (fVar14 = (float)table->RowBgColor[(ulong)(table->FreezeRowsCount < 1) * 4 + 0x1a] +
               pIVar8->LastTopHeadersRowHeight, fVar15 = fVar16, fVar14 <= fVar16)) {
    fVar15 = fVar14;
  }
  if ((uVar9 >> 9 & 1) != 0) {
    uVar10 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_50 = fVar15;
    local_4c = fVar16;
    local_48 = fVar13;
    while ((long)uVar10 < (long)table->ColumnsCount) {
      uVar9 = (uint)uVar10;
      if ((table->EnabledMaskByDisplayOrder[uVar10 >> 5 & 0x7ffffff] >> (uVar9 & 0x1f) & 1) == 0) {
        uVar10 = uVar10 + 1;
      }
      else {
        sVar2 = (table->DisplayOrderToIndex).Data[uVar10];
        if (table->ResizedColumn == sVar2) {
          bVar6 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar6 = false;
        }
        pIVar11 = (table->Columns).Data + (int)sVar2;
        uVar10 = uVar10 + 1;
        fVar15 = pIVar11->MaxX;
        pIVar1 = &(table->InnerClipRect).Max;
        if ((bool)((fVar15 < pIVar1->x || fVar15 == pIVar1->x) | bVar6)) {
          if ((((pIVar11->NextEnabledColumn != -1) || ((pIVar11->Flags & 0x40000020U) == 0)) ||
              ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar11->ClipRect).Min.x < fVar15)) {
            fVar14 = fVar16;
            if (((table->HoveredColumnBorder != sVar2 && !bVar6) &&
                (uVar10 != ((long)table->FreezeColumnsCount & 0xffffffffU))) &&
               ((table->Flags & 0x1800) != 0)) {
              fVar14 = local_50;
            }
            if (fVar13 < fVar14) {
              local_70.y = fVar14;
              local_70.x = fVar15;
              local_68.x = fVar15;
              local_68.y = fVar13;
              IVar7 = TableGetColumnBorderCol(table,uVar9,(int)sVar2);
              ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar7,1.0);
              fVar16 = local_4c;
              fVar13 = local_48;
            }
          }
        }
      }
    }
    uVar9 = table->Flags;
  }
  if ((uVar9 & 0x500) == 0) goto LAB_00185092;
  IVar4 = (table->OuterRect).Min;
  IVar5 = (table->OuterRect).Max;
  local_68.x = IVar4.x;
  local_68.y = IVar4.y;
  aIStack_60[0].x = IVar5.x;
  aIStack_60[0].y = IVar5.y;
  IVar7 = table->BorderColorStrong;
  if ((uVar9 & 0x500) == 0x500) {
    local_70.y = aIStack_60[0].y + 1.0;
    local_70.x = aIStack_60[0].x + 1.0;
    ImDrawList::AddRect(draw_list,&local_68,&local_70,IVar7,0.0,0,1.0);
  }
  else {
    if ((uVar9 >> 10 & 1) == 0) {
      if ((uVar9 >> 8 & 1) == 0) goto LAB_0018508f;
      local_70.y = local_68.y;
      local_70.x = aIStack_60[0].x;
      ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar7,1.0);
      local_70.y = aIStack_60[0].y;
      local_70.x = local_68.x;
    }
    else {
      local_70.y = aIStack_60[0].y;
      local_70.x = local_68.x;
      ImDrawList::AddLine(draw_list,&local_68,&local_70,IVar7,1.0);
      local_70.y = local_68.y;
      local_70.x = aIStack_60[0].x;
    }
    ImDrawList::AddLine(draw_list,&local_70,aIStack_60,IVar7,1.0);
  }
LAB_0018508f:
  uVar9 = table->Flags;
LAB_00185092:
  if ((((char)uVar9 < '\0') && (fVar16 = table->RowPosY2, fVar16 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar16 && (fVar16 < (table->BgClipRect).Max.y)))) {
    local_68.x = table->BorderX1;
    local_70.y = fVar16;
    local_70.x = table->BorderX2;
    local_68.y = fVar16;
    ImDrawList::AddLine(draw_list,&local_68,&local_70,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = ImMax(table->InnerRect.Min.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight) + ((table->Flags & ImGuiTableFlags_BordersOuterH) ? 1.0f : 0.0f);
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table_instance->LastTopHeadersRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            float draw_y2 = (is_hovered || is_resized || is_frozen_separator || (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) == 0) ? draw_y2_body : draw_y2_head;
            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), TableGetColumnBorderCol(table, order_n, column_n), border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max + ImVec2(1, 1), outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border between it is above outer border.
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}